

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void ReleaseMetaLookup(nodecontext *p,nodeclass *Class)

{
  nodeclass *pnVar1;
  nodemetalookuphead *pnVar2;
  
  pnVar1 = Class->ParentClass;
  pnVar2 = Class->MetaGet;
  if (pnVar1 != (nodeclass *)0x0) {
    if (pnVar2 == pnVar1->MetaGet) {
      Class->MetaGet = (nodemetalookuphead *)0x0;
      pnVar2 = (nodemetalookuphead *)0x0;
    }
    if (Class->MetaSet == pnVar1->MetaSet) {
      Class->MetaSet = (nodemetalookuphead *)0x0;
    }
    if (Class->MetaUnSet == pnVar1->MetaUnSet) {
      Class->MetaUnSet = (nodemetalookuphead *)0x0;
    }
  }
  if (pnVar2 != (nodemetalookuphead *)0x0) {
    (*p->NodeConstHeap->Free)(p->NodeConstHeap,pnVar2,pnVar2->Upper * 0x10 + 0x18);
    Class->MetaGet = (nodemetalookuphead *)0x0;
  }
  pnVar2 = Class->MetaSet;
  if (pnVar2 != (nodemetalookuphead *)0x0) {
    (*p->NodeConstHeap->Free)(p->NodeConstHeap,pnVar2,pnVar2->Upper * 0x10 + 0x18);
    Class->MetaSet = (nodemetalookuphead *)0x0;
  }
  pnVar2 = Class->MetaUnSet;
  if (pnVar2 != (nodemetalookuphead *)0x0) {
    (*p->NodeConstHeap->Free)(p->NodeConstHeap,pnVar2,pnVar2->Upper * 0x10 + 0x18);
    Class->MetaUnSet = (nodemetalookuphead *)0x0;
  }
  return;
}

Assistant:

static NOINLINE void ReleaseMetaLookup(nodecontext* p, nodeclass* Class)
{
    if (Class->ParentClass)
    {
        if (Class->MetaGet==Class->ParentClass->MetaGet)
            Class->MetaGet=NULL;
        if (Class->MetaSet==Class->ParentClass->MetaSet)
            Class->MetaSet=NULL;
        if (Class->MetaUnSet==Class->ParentClass->MetaUnSet)
            Class->MetaUnSet=NULL;
    }

    if (Class->MetaGet)
    {
        MemHeap_Free(p->NodeConstHeap,Class->MetaGet,sizeof(nodemetalookuphead)+(Class->MetaGet->Upper+1)*sizeof(nodemetalookup));
        Class->MetaGet = NULL;
    }

    if (Class->MetaSet)
    {
        MemHeap_Free(p->NodeConstHeap,Class->MetaSet,sizeof(nodemetalookuphead)+(Class->MetaSet->Upper+1)*sizeof(nodemetalookup));
        Class->MetaSet = NULL;
    }

    if (Class->MetaUnSet)
    {
        MemHeap_Free(p->NodeConstHeap,Class->MetaUnSet,sizeof(nodemetalookuphead)+(Class->MetaUnSet->Upper+1)*sizeof(nodemetalookup));
        Class->MetaUnSet = NULL;
    }
}